

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

uint64_t kratos::Simulator::static_evaluate_expr(Var *expr)

{
  uint64_t uVar1;
  UserException *pUVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  undefined1 local_240 [8];
  Simulator sim;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> result;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Simulator((Simulator *)local_240,(Generator *)0x0);
  eval_expr((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
            &sim.simulation_depth_,(Simulator *)local_240,expr);
  if (result.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    if ((long)result.
              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start - sim.simulation_depth_ == 8) {
      uVar1 = *(uint64_t *)sim.simulation_depth_;
      if (0 < (long)uVar1) {
        std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
        _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&sim.simulation_depth_);
        ~Simulator((Simulator *)local_240);
        return uVar1;
      }
      pUVar2 = (UserException *)__cxa_allocate_exception(0x10);
      (*(expr->super_IRNode)._vptr_IRNode[0x1f])(&local_58,expr);
      local_38 = local_58;
      uStack_30 = uStack_50;
      bVar3 = fmt::v7::to_string_view<char,_0>("Unable to static elaborate value {0}");
      format_str_00.data_ = (char *)bVar3.size_;
      format_str_00.size_ = 0xd;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_38;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &result.
                  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ._M_engaged,(detail *)bVar3.data_,format_str_00,args_00);
      UserException::UserException
                (pUVar2,(string *)
                        &result.
                         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         ._M_engaged);
      __cxa_throw(pUVar2,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pUVar2 = (UserException *)__cxa_allocate_exception(0x10);
  (*(expr->super_IRNode)._vptr_IRNode[0x1f])(&local_58,expr);
  local_38 = local_58;
  uStack_30 = uStack_50;
  bVar3 = fmt::v7::to_string_view<char,_0>("Unable to static elaborate value {0}");
  format_str.data_ = (char *)bVar3.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)
             &result.
              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_engaged,(detail *)bVar3.data_,format_str,args);
  UserException::UserException
            (pUVar2,(string *)
                    &result.
                     super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_engaged);
  __cxa_throw(pUVar2,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t Simulator::static_evaluate_expr(Var *expr) {
    // static evaluate the expression using built-in simulator
    Simulator sim(nullptr);
    auto result = sim.eval_expr(expr);
    // sanity check, no coverage
    // LCOV_EXCL_START
    if (!result || (*result).size() != 1)
        throw UserException(::format("Unable to static elaborate value {0}", expr->to_string()));
    auto value = static_cast<int64_t>((*result)[0]);
    if (value <= 0)
        throw UserException(::format("Unable to static elaborate value {0}", expr->to_string()));
    return static_cast<uint64_t>(value);
}